

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

string * cfd::core::ToBase58String
                   (string *__return_storage_ptr__,ByteData *serialize_data,string *caller_name)

{
  int iVar1;
  size_t sVar2;
  CfdException *pCVar3;
  char *wally_string;
  int ret;
  undefined4 uStack_54;
  char *output;
  undefined1 local_48 [32];
  
  output = (char *)0x0;
  sVar2 = ByteData::GetDataSize(serialize_data);
  if (sVar2 != 0x4e) {
    local_48._0_8_ = "cfdcore_hdwallet.cpp";
    local_48._8_4_ = 0x8b;
    local_48._16_8_ = "ToBase58String";
    _ret = ByteData::GetDataSize(serialize_data);
    logger::warn<std::__cxx11::string_const&,unsigned_long>
              ((CfdSourceLocation *)local_48,"{} serialize_data size illegal. size={}",caller_name,
               (unsigned_long *)&ret);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     caller_name," serialize_data size error.");
    CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_48);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
                     serialize_data);
  iVar1 = wally_base58_from_bytes((uchar *)local_48._0_8_,0x4e,1,&output);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  _ret = CONCAT44(uStack_54,iVar1);
  if (iVar1 == 0) {
    WallyUtil::ConvertStringAndFree_abi_cxx11_
              (__return_storage_ptr__,(WallyUtil *)output,wally_string);
    return __return_storage_ptr__;
  }
  local_48._0_8_ = "cfdcore_hdwallet.cpp";
  local_48._8_4_ = 0x96;
  local_48._16_8_ = "ToBase58String";
  logger::warn<std::__cxx11::string_const&,int&>
            ((CfdSourceLocation *)local_48,"{}, wally_base58_from_bytes error. ret={}",caller_name,
             &ret);
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   caller_name," base58 encode error.");
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_48);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

static std::string ToBase58String(
    const ByteData& serialize_data, const std::string& caller_name) {
  char* output = nullptr;
  if (serialize_data.GetDataSize() != BIP32_SERIALIZED_LEN) {
    warn(
        CFD_LOG_SOURCE, "{} serialize_data size illegal. size={}", caller_name,
        serialize_data.GetDataSize());
    throw CfdException(
        CfdError::kCfdIllegalStateError,
        caller_name + " serialize_data size error.");
  }
  int ret = wally_base58_from_bytes(
      serialize_data.GetBytes().data(), BIP32_SERIALIZED_LEN,
      BASE58_FLAG_CHECKSUM, &output);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "{}, wally_base58_from_bytes error. ret={}",
        caller_name, ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        caller_name + " base58 encode error.");
  }
  return WallyUtil::ConvertStringAndFree(output);
}